

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPlaneDetectorBeginInfoEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrPlaneDetectorBeginInfoEXT *pXVar2;
  byte bVar3;
  XrStructureType XVar4;
  XrPlaneDetectorOrientationEXT XVar5;
  XrPlaneDetectorSemanticTypeEXT XVar6;
  pointer pcVar7;
  PFN_xrStructureTypeToString p_Var8;
  void *value_00;
  XrStructureType __val;
  XrPlaneDetectorOrientationEXT __val_00;
  XrPlaneDetectorSemanticTypeEXT __val_01;
  string *psVar9;
  uint uVar10;
  char cVar11;
  bool bVar12;
  char cVar13;
  uint uVar14;
  char *pcVar15;
  XrInstance pXVar16;
  invalid_argument *piVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  XrPlaneDetectorBeginInfoEXT *pXVar21;
  XrGeneratedDispatchTable *pXVar22;
  uint uVar23;
  ulong uVar24;
  string type_prefix;
  string next_prefix;
  string time_prefix;
  string basespace_prefix;
  string boundingboxpose_prefix;
  string semantictypes_prefix;
  string orientations_prefix;
  string semantictypecount_prefix;
  string orientationcount_prefix;
  string maxplanes_prefix;
  string boundingboxextent_prefix;
  string minarea_prefix;
  ostringstream oss_semanticTypes_array;
  ostringstream oss_minArea;
  ostringstream oss_baseSpace;
  ostringstream oss_maxPlanes;
  ostringstream oss_semanticTypeCount;
  ostringstream oss_orientationCount;
  ostringstream oss_orientations_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  long *local_c90;
  long local_c88;
  long local_c80 [2];
  XrPlaneDetectorBeginInfoEXT *local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  string *local_c28;
  ulong local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  long *local_b58;
  long local_b50;
  long local_b48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  undefined1 local_b18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b08;
  string local_af8;
  undefined1 local_ad8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac8;
  string local_ab8;
  string local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [3];
  ios_base local_a08 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900 [3];
  ios_base local_890 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  PFN_xrGetFacialExpressionsHTC local_768;
  PFN_xrGetSerializedSceneFragmentDataMSFT p_Stack_760;
  PFN_xrEnumerateDisplayRefreshRatesFB local_758;
  PFN_xrGetHandMeshFB p_Stack_750;
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  undefined1 local_320 [24];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_788.field_2;
  local_c70 = value;
  local_788._M_dataplus._M_p = (pointer)paVar1;
  local_320._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_788,'\x12');
  *local_788._M_dataplus._M_p = '0';
  local_788._M_dataplus._M_p[1] = 'x';
  pcVar15 = local_788._M_dataplus._M_p + local_788._M_string_length + -1;
  lVar18 = 0;
  do {
    bVar3 = local_320[lVar18];
    *pcVar15 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
    pcVar15[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
    lVar18 = lVar18 + 1;
    pcVar15 = pcVar15 + -2;
  } while (lVar18 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != paVar1) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cb0,pcVar7,pcVar7 + prefix->_M_string_length);
  pXVar2 = local_c70;
  std::__cxx11::string::append((char *)&local_cb0);
  local_c28 = prefix;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar4 = pXVar2->type;
    __val = -XVar4;
    if (0 < (int)XVar4) {
      __val = XVar4;
    }
    uVar23 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar24 = (ulong)__val;
      uVar10 = 4;
      do {
        uVar23 = uVar10;
        uVar14 = (uint)uVar24;
        if (uVar14 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_00202468;
        }
        if (uVar14 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_00202468;
        }
        if (uVar14 < 10000) goto LAB_00202468;
        uVar24 = uVar24 / 10000;
        uVar10 = uVar23 + 4;
      } while (99999 < uVar14);
      uVar23 = uVar23 + 1;
    }
LAB_00202468:
    local_788._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_788,(char)uVar23 - (char)((int)XVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_788._M_dataplus._M_p + (XVar4 >> 0x1f),uVar23,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_cb0,&local_788);
    prefix = local_c28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != paVar1) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_758 = (PFN_xrEnumerateDisplayRefreshRatesFB)0x0;
    p_Stack_750 = (PFN_xrGetHandMeshFB)0x0;
    local_768 = (PFN_xrGetFacialExpressionsHTC)0x0;
    p_Stack_760 = (PFN_xrGetSerializedSceneFragmentDataMSFT)0x0;
    local_788.field_2._M_allocated_capacity = 0;
    local_788.field_2._8_8_ = 0;
    local_788._M_dataplus._M_p = (pointer)0x0;
    local_788._M_string_length = 0;
    p_Var8 = gen_dispatch_table->StructureTypeToString;
    pXVar16 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var8)(pXVar16,local_c70->type,(char *)&local_788);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_cb0,(char (*) [64])&local_788);
  }
  local_c90 = local_c80;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c90,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_c90);
  value_00 = local_c70->next;
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a98,local_c90,local_c88 + (long)local_c90);
  bVar12 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_a98,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  if (!bVar12) {
    piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
    __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c48,pcVar7,pcVar7 + prefix->_M_string_length);
  pXVar21 = local_c70;
  std::__cxx11::string::append((char *)&local_c48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
  *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&local_788);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&local_c48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  pXVar2 = (XrPlaneDetectorBeginInfoEXT *)(local_320 + 0x10);
  if ((XrPlaneDetectorBeginInfoEXT *)local_320._0_8_ != pXVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c68,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_c68);
  uVar24 = pXVar21->time;
  uVar20 = -uVar24;
  if (0 < (long)uVar24) {
    uVar20 = uVar24;
  }
  uVar23 = 1;
  if (9 < uVar20) {
    uVar19 = uVar20;
    uVar10 = 4;
    do {
      uVar23 = uVar10;
      if (uVar19 < 100) {
        uVar23 = uVar23 - 2;
        goto LAB_002026d3;
      }
      if (uVar19 < 1000) {
        uVar23 = uVar23 - 1;
        goto LAB_002026d3;
      }
      if (uVar19 < 10000) goto LAB_002026d3;
      bVar12 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      uVar10 = uVar23 + 4;
    } while (bVar12);
    uVar23 = uVar23 + 1;
  }
LAB_002026d3:
  local_320._0_8_ = pXVar2;
  std::__cxx11::string::_M_construct((ulong)local_320,(char)uVar23 - (char)((long)uVar24 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)(local_320._0_8_ + -((long)uVar24 >> 0x3f)),uVar23,uVar20);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&local_c68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  psVar9 = local_c28;
  pXVar21 = local_c70;
  if ((XrPlaneDetectorBeginInfoEXT *)local_320._0_8_ != pXVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
  pcVar7 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b98,pcVar7,pcVar7 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_b98);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)((long)auStack_308 + *(long *)(local_320._0_8_ + -0x18)) =
       *(uint *)((long)auStack_308 + *(long *)(local_320._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_b98,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
  pcVar7 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_bd8,pcVar7,pcVar7 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_bd8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [37])"const XrPlaneDetectorOrientationEXT*",&local_bd8,local_498)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
  }
  if (pXVar21->orientationCount != 0) {
    paVar1 = &local_a78[0].field_2;
    uVar24 = 0;
    do {
      local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,local_bd8._M_dataplus._M_p,
                 local_bd8._M_dataplus._M_p + local_bd8._M_string_length);
      std::__cxx11::string::append((char *)local_498);
      cVar13 = '\x01';
      if (9 < uVar24) {
        uVar20 = uVar24;
        cVar11 = '\x04';
        do {
          cVar13 = cVar11;
          uVar23 = (uint)uVar20;
          if (uVar23 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_00202996;
          }
          if (uVar23 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_00202996;
          }
          if (uVar23 < 10000) goto LAB_00202996;
          uVar20 = (uVar20 & 0xffffffff) / 10000;
          cVar11 = cVar13 + '\x04';
        } while (99999 < uVar23);
        cVar13 = cVar13 + '\x01';
      }
LAB_00202996:
      local_a78[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)local_a78,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_a78[0]._M_dataplus._M_p,(uint)local_a78[0]._M_string_length,(uint)uVar24);
      std::__cxx11::string::_M_append((char *)local_498,(ulong)local_a78[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_a78[0]._M_dataplus._M_p,local_a78[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::string::append((char *)local_498);
      XVar5 = pXVar21->orientations[uVar24];
      __val_00 = -XVar5;
      if (0 < (int)XVar5) {
        __val_00 = XVar5;
      }
      uVar23 = 1;
      if (9 < __val_00) {
        uVar20 = (ulong)__val_00;
        uVar10 = 4;
        do {
          uVar23 = uVar10;
          uVar14 = (uint)uVar20;
          if (uVar14 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_00202a68;
          }
          if (uVar14 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_00202a68;
          }
          if (uVar14 < 10000) goto LAB_00202a68;
          uVar20 = uVar20 / 10000;
          uVar10 = uVar23 + 4;
        } while (99999 < uVar14);
        uVar23 = uVar23 + 1;
      }
LAB_00202a68:
      local_c20 = uVar24;
      local_a78[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)local_a78,(char)uVar23 - (char)((int)XVar5 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_a78[0]._M_dataplus._M_p + (XVar5 >> 0x1f),uVar23,__val_00);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [37])"const XrPlaneDetectorOrientationEXT*",local_498,
                 local_a78);
      pXVar21 = local_c70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_a78[0]._M_dataplus._M_p,local_a78[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar24 = local_c20 + 1;
    } while (uVar24 < pXVar21->orientationCount);
  }
  psVar9 = local_c28;
  local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
  pcVar7 = (local_c28->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_bb8,pcVar7,pcVar7 + local_c28->_M_string_length);
  std::__cxx11::string::append((char *)&local_bb8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"0x",2);
  *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_bb8,local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78[0]._M_dataplus._M_p != &local_a78[0].field_2) {
    operator_delete(local_a78[0]._M_dataplus._M_p,local_a78[0].field_2._M_allocated_capacity + 1);
  }
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  pcVar7 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_bf8,pcVar7,pcVar7 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_bf8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a78);
  *(uint *)((long)&local_a78[0].field_2 + *(long *)(local_a78[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_a78[0].field_2 + *(long *)(local_a78[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_a78);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [38])"const XrPlaneDetectorSemanticTypeEXT*",&local_bf8,local_610
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
    operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
  }
  if (pXVar21->semanticTypeCount != 0) {
    paVar1 = &local_900[0].field_2;
    uVar24 = 0;
    do {
      local_610[0]._M_dataplus._M_p = (pointer)&local_610[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_610,local_bf8._M_dataplus._M_p,
                 local_bf8._M_dataplus._M_p + local_bf8._M_string_length);
      std::__cxx11::string::append((char *)local_610);
      cVar13 = '\x01';
      if (9 < uVar24) {
        uVar20 = uVar24;
        cVar11 = '\x04';
        do {
          cVar13 = cVar11;
          uVar23 = (uint)uVar20;
          if (uVar23 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_00202d81;
          }
          if (uVar23 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_00202d81;
          }
          if (uVar23 < 10000) goto LAB_00202d81;
          uVar20 = (uVar20 & 0xffffffff) / 10000;
          cVar11 = cVar13 + '\x04';
        } while (99999 < uVar23);
        cVar13 = cVar13 + '\x01';
      }
LAB_00202d81:
      local_900[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)local_900,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_900[0]._M_dataplus._M_p,(uint)local_900[0]._M_string_length,(uint)uVar24);
      std::__cxx11::string::_M_append((char *)local_610,(ulong)local_900[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_900[0]._M_dataplus._M_p,local_900[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::string::append((char *)local_610);
      XVar6 = pXVar21->semanticTypes[uVar24];
      __val_01 = -XVar6;
      if (0 < (int)XVar6) {
        __val_01 = XVar6;
      }
      uVar23 = 1;
      if (9 < __val_01) {
        uVar20 = (ulong)__val_01;
        uVar10 = 4;
        do {
          uVar23 = uVar10;
          uVar14 = (uint)uVar20;
          if (uVar14 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_00202e53;
          }
          if (uVar14 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_00202e53;
          }
          if (uVar14 < 10000) goto LAB_00202e53;
          uVar20 = uVar20 / 10000;
          uVar10 = uVar23 + 4;
        } while (99999 < uVar14);
        uVar23 = uVar23 + 1;
      }
LAB_00202e53:
      local_c20 = uVar24;
      local_900[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)local_900,(char)uVar23 - (char)((int)XVar6 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_900[0]._M_dataplus._M_p + (XVar6 >> 0x1f),uVar23,__val_01);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [38])"const XrPlaneDetectorSemanticTypeEXT*",local_610,
                 local_900);
      pXVar21 = local_c70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_900[0]._M_dataplus._M_p,local_900[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
        operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar24 = local_c20 + 1;
    } while (uVar24 < pXVar21->semanticTypeCount);
  }
  psVar9 = local_c28;
  local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
  pcVar7 = (local_c28->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b78,pcVar7,pcVar7 + local_c28->_M_string_length);
  std::__cxx11::string::append((char *)&local_b78);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"0x",2);
  *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_610);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_b78,local_900);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900[0]._M_dataplus._M_p != &local_900[0].field_2) {
    operator_delete(local_900[0]._M_dataplus._M_p,local_900[0].field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (psVar9->_M_dataplus)._M_p;
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b38,pcVar7,pcVar7 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_b38);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
  *(undefined8 *)
   ((long)&local_900[0]._M_string_length + *(long *)(local_900[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::_M_insert<double>((double)pXVar21->minArea);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_b38,&local_c18);
  paVar1 = &local_c18.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (psVar9->_M_dataplus)._M_p;
  local_c18._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c18,pcVar7,pcVar7 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_c18);
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ab8,local_c18._M_dataplus._M_p,
             local_c18._M_dataplus._M_p + local_c18._M_string_length);
  pXVar22 = (XrGeneratedDispatchTable *)local_ad8;
  local_ad8._0_8_ = local_ad8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar22,"XrPosef","");
  bVar12 = ApiDumpOutputXrStruct
                     (pXVar22,&local_c70->boundingBoxPose,&local_ab8,(string *)local_ad8,false,
                      contents);
  if ((undefined1 *)local_ad8._0_8_ != local_ad8 + 0x10) {
    operator_delete((void *)local_ad8._0_8_,(ulong)(local_ac8._M_allocated_capacity + 1));
  }
  psVar9 = local_c28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar12) {
    piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
    __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar7 = (psVar9->_M_dataplus)._M_p;
  local_b58 = local_b48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b58,pcVar7,pcVar7 + psVar9->_M_string_length);
  std::__cxx11::string::append((char *)&local_b58);
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_af8,local_b58,local_b50 + (long)local_b58);
  pXVar22 = (XrGeneratedDispatchTable *)local_b18;
  local_b18._0_8_ = local_b18 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar22,"XrExtent3DfEXT","");
  bVar12 = ApiDumpOutputXrStruct
                     (pXVar22,&local_c70->boundingBoxExtent,&local_af8,(string *)local_b18,false,
                      contents);
  if ((undefined1 *)local_b18._0_8_ != local_b18 + 0x10) {
    operator_delete((void *)local_b18._0_8_,(ulong)(local_b08._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
  }
  if (bVar12) {
    if (local_b58 != local_b48) {
      operator_delete(local_b58,local_b48[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c18._M_dataplus._M_p != paVar1) {
      operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
    std::ios_base::~ios_base(local_890);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
      operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    std::ios_base::~ios_base(local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
      operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a78);
    std::ios_base::~ios_base(local_a08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
      operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
      operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
      operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
      operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
      operator_delete(local_c68._M_dataplus._M_p,local_c68.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
    std::ios_base::~ios_base(local_718);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
      operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
    }
    if (local_c90 != local_c80) {
      operator_delete(local_c90,local_c80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
      operator_delete(local_cb0._M_dataplus._M_p,local_cb0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar17,"Invalid Operation");
  __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPlaneDetectorBeginInfoEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string basespace_prefix = prefix;
        basespace_prefix += "baseSpace";
        std::ostringstream oss_baseSpace;
        oss_baseSpace << std::hex << reinterpret_cast<const void*>(value->baseSpace);
        contents.emplace_back("XrSpace", basespace_prefix, oss_baseSpace.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        std::string orientationcount_prefix = prefix;
        orientationcount_prefix += "orientationCount";
        std::ostringstream oss_orientationCount;
        oss_orientationCount << "0x" << std::hex << (value->orientationCount);
        contents.emplace_back("uint32_t", orientationcount_prefix, oss_orientationCount.str());
        std::string orientations_prefix = prefix;
        orientations_prefix += "orientations";
        std::ostringstream oss_orientations_array;
        oss_orientations_array << std::hex << reinterpret_cast<const void*>(value->orientations);
        contents.emplace_back("const XrPlaneDetectorOrientationEXT*", orientations_prefix, oss_orientations_array.str());
        for (uint32_t value_orientations_inc = 0; value_orientations_inc < value->orientationCount; ++value_orientations_inc) {
            std::string orientations_array_prefix = orientations_prefix;
            orientations_array_prefix += "[";
            orientations_array_prefix += std::to_string(value_orientations_inc);
            orientations_array_prefix += "]";
            contents.emplace_back("const XrPlaneDetectorOrientationEXT*", orientations_array_prefix, std::to_string(value->orientations[value_orientations_inc]));
        }
        std::string semantictypecount_prefix = prefix;
        semantictypecount_prefix += "semanticTypeCount";
        std::ostringstream oss_semanticTypeCount;
        oss_semanticTypeCount << "0x" << std::hex << (value->semanticTypeCount);
        contents.emplace_back("uint32_t", semantictypecount_prefix, oss_semanticTypeCount.str());
        std::string semantictypes_prefix = prefix;
        semantictypes_prefix += "semanticTypes";
        std::ostringstream oss_semanticTypes_array;
        oss_semanticTypes_array << std::hex << reinterpret_cast<const void*>(value->semanticTypes);
        contents.emplace_back("const XrPlaneDetectorSemanticTypeEXT*", semantictypes_prefix, oss_semanticTypes_array.str());
        for (uint32_t value_semantictypes_inc = 0; value_semantictypes_inc < value->semanticTypeCount; ++value_semantictypes_inc) {
            std::string semantictypes_array_prefix = semantictypes_prefix;
            semantictypes_array_prefix += "[";
            semantictypes_array_prefix += std::to_string(value_semantictypes_inc);
            semantictypes_array_prefix += "]";
            contents.emplace_back("const XrPlaneDetectorSemanticTypeEXT*", semantictypes_array_prefix, std::to_string(value->semanticTypes[value_semantictypes_inc]));
        }
        std::string maxplanes_prefix = prefix;
        maxplanes_prefix += "maxPlanes";
        std::ostringstream oss_maxPlanes;
        oss_maxPlanes << "0x" << std::hex << (value->maxPlanes);
        contents.emplace_back("uint32_t", maxplanes_prefix, oss_maxPlanes.str());
        std::string minarea_prefix = prefix;
        minarea_prefix += "minArea";
        std::ostringstream oss_minArea;
        oss_minArea << std::setprecision(32) << (value->minArea);
        contents.emplace_back("float", minarea_prefix, oss_minArea.str());
        std::string boundingboxpose_prefix = prefix;
        boundingboxpose_prefix += "boundingBoxPose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBoxPose, boundingboxpose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string boundingboxextent_prefix = prefix;
        boundingboxextent_prefix += "boundingBoxExtent";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBoxExtent, boundingboxextent_prefix, "XrExtent3DfEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}